

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int getAutoVacuum(char *z)

{
  int iVar1;
  uint uVar2;
  int x;
  uint local_c;
  
  iVar1 = sqlite3_stricmp(z,"none");
  if (iVar1 == 0) {
    uVar2 = 0;
  }
  else {
    iVar1 = sqlite3_stricmp(z,"full");
    if (iVar1 == 0) {
      uVar2 = 1;
    }
    else {
      iVar1 = sqlite3_stricmp(z,"incremental");
      if (iVar1 == 0) {
        uVar2 = 2;
      }
      else {
        local_c = 0;
        if (z != (char *)0x0) {
          sqlite3GetInt32(z,(int *)&local_c);
        }
        uVar2 = local_c & 0xff;
        if (2 < local_c) {
          uVar2 = 0;
        }
      }
    }
  }
  return uVar2;
}

Assistant:

static int getAutoVacuum(const char *z){
  int i;
  if( 0==sqlite3StrICmp(z, "none") ) return BTREE_AUTOVACUUM_NONE;
  if( 0==sqlite3StrICmp(z, "full") ) return BTREE_AUTOVACUUM_FULL;
  if( 0==sqlite3StrICmp(z, "incremental") ) return BTREE_AUTOVACUUM_INCR;
  i = sqlite3Atoi(z);
  return (u8)((i>=0&&i<=2)?i:0);
}